

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleCameraNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *pScene)

{
  aiCamera *this_00;
  aiNode *paVar1;
  char *sz;
  aiNode *newNode;
  aiCamera *camera;
  aiScene *pScene_local;
  DDLNode *node_local;
  OpenGEXImporter *this_local;
  
  camera = (aiCamera *)pScene;
  pScene_local = (aiScene *)node;
  node_local = (DDLNode *)this;
  paVar1 = (aiNode *)operator_new(0x438);
  aiCamera::aiCamera((aiCamera *)paVar1);
  newNode = paVar1;
  std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::push_back
            (&this->m_cameraCache,(value_type *)&newNode);
  this->m_currentCamera = (aiCamera *)newNode;
  paVar1 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar1);
  pushNode(this,paVar1,(aiScene *)camera);
  this->m_tokenType = 6;
  this->m_currentNode = paVar1;
  handleNodes(this,(DDLNode *)pScene_local,(aiScene *)camera);
  popNode(this);
  this_00 = this->m_currentCamera;
  sz = aiString::C_Str((aiString *)paVar1);
  aiString::Set(&this_00->mName,sz);
  return;
}

Assistant:

void OpenGEXImporter::handleCameraNode( DDLNode *node, aiScene *pScene ) {
    aiCamera *camera( new aiCamera );
    m_cameraCache.push_back( camera );
    m_currentCamera = camera;

    aiNode *newNode = new aiNode;
    pushNode( newNode, pScene );
    m_tokenType = Grammar::CameraNodeToken;
    m_currentNode = newNode;

    handleNodes( node, pScene );

    popNode();

    m_currentCamera->mName.Set( newNode->mName.C_Str() );
}